

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O0

int write_ssl_and_get_response(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong local_d0;
  size_t idx;
  size_t i;
  uchar local_b8 [4];
  char code [4];
  uchar data [128];
  uint local_2c;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  local_d0 = 0;
  printf("\n%s");
  while( true ) {
    bVar1 = false;
    if (len != 0) {
      local_2c = mbedtls_ssl_write(ssl,buf,len);
      bVar1 = (int)local_2c < 1;
    }
    if (!bVar1) break;
    if ((local_2c != 0xffff9700) && (local_2c != 0xffff9780)) {
      printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)local_2c);
      return -1;
    }
  }
  while( true ) {
    do {
      do {
        memset(local_b8,0,0x80);
        uVar2 = mbedtls_ssl_read(ssl,local_b8,0x7f);
      } while (uVar2 == 0xffff9700);
    } while (uVar2 == 0xffff9780);
    if (uVar2 == 0xffff8780) break;
    if ((int)uVar2 < 1) {
      printf("failed\n  ! mbedtls_ssl_read returned %d\n\n",(ulong)uVar2);
      return -1;
    }
    printf("\n%s");
    for (idx = 0; idx < (ulong)(long)(int)uVar2; idx = idx + 1) {
      if (local_b8[idx] == '\n') {
        if ((((local_d0 == 4) && ('/' < i._4_1_)) && (i._4_1_ < ':')) && (i._7_1_ == ' ')) {
          i._7_1_ = 0;
          iVar3 = atoi((char *)((long)&i + 4));
          return iVar3;
        }
        local_d0 = 0;
      }
      else if (local_d0 < 4) {
        local_b8[local_d0 - 4] = local_b8[idx];
        local_d0 = local_d0 + 1;
      }
    }
  }
  return -1;
}

Assistant:

static int write_ssl_and_get_response( mbedtls_ssl_context *ssl, unsigned char *buf, size_t len )
{
    int ret;
    unsigned char data[128];
    char code[4];
    size_t i, idx = 0;

    mbedtls_printf("\n%s", buf);
    while( len && ( ret = mbedtls_ssl_write( ssl, buf, len ) ) <= 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            return -1;
        }
    }

    do
    {
        len = sizeof( data ) - 1;
        memset( data, 0, sizeof( data ) );
        ret = mbedtls_ssl_read( ssl, data, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret == MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY )
            return -1;

        if( ret <= 0 )
        {
            mbedtls_printf( "failed\n  ! mbedtls_ssl_read returned %d\n\n", ret );
            return -1;
        }

        mbedtls_printf("\n%s", data);
        len = ret;
        for( i = 0; i < len; i++ )
        {
            if( data[i] != '\n' )
            {
                if( idx < 4 )
                    code[ idx++ ] = data[i];
                continue;
            }

            if( idx == 4 && code[0] >= '0' && code[0] <= '9' && code[3] == ' ' )
            {
                code[3] = '\0';
                return atoi( code );
            }

            idx = 0;
        }
    }
    while( 1 );
}